

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Vector<int,_4>_>::genFixeds
          (DefaultSampling<tcu::Vector<int,_4>_> *this,FloatFormat *fmt,
          vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *dst)

{
  size_t scalarNdx;
  ulong uVar1;
  vector<int,_std::allocator<int>_> scalars;
  _Vector_base<int,_std::allocator<int>_> local_48;
  Vector<int,_4> local_28;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DefaultSampling<int>::genFixeds
            ((DefaultSampling<int> *)
             &instance<deqp::gls::BuiltinPrecisionTests::DefaultSampling<int>>()::s_instance,fmt,
             (vector<int,_std::allocator<int>_> *)&local_48);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar1 = uVar1 + 1) {
    tcu::Vector<int,_4>::Vector(&local_28,local_48._M_impl.super__Vector_impl_data._M_start[uVar1]);
    std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
    emplace_back<tcu::Vector<int,4>>
              ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)dst,&local_28);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));
	}